

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rg_etc1.cpp
# Opt level: O0

bool crnlib::rg_etc1::etc1_block::unpack_color5
               (uint *r,uint *g,uint *b,uint16 packed_color5,uint16 packed_delta3,bool scaled,
               uint alpha)

{
  bool bVar1;
  undefined2 in_CX;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 aVar2;
  uint *in_RDX;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 *in_RSI;
  uint *in_RDI;
  undefined2 in_R8W;
  byte in_R9B;
  bool success;
  color_quad_u8 result;
  anon_union_4_3_dd316fa8_for_color_quad_u8_0 local_24;
  byte local_1d;
  uint alpha_00;
  
  alpha_00 = CONCAT22(in_CX,in_R8W);
  local_1d = in_R9B & 1;
  color_quad_u8::color_quad_u8((color_quad_u8 *)&local_24.field_0);
  bVar1 = unpack_color5((color_quad_u8 *)&in_RSI->field_0,(uint16)((ulong)in_RDX >> 0x30),
                        (uint16)((ulong)in_RDX >> 0x20),SUB81((ulong)in_RDX >> 0x18,0),alpha_00);
  *in_RDI = (uint)local_24.field_0.r;
  aVar2.m_u32._1_3_ = 0;
  aVar2.field_0.r = local_24.field_0.g;
  *in_RSI = aVar2;
  *in_RDX = (uint)local_24.field_0.b;
  return bVar1;
}

Assistant:

bool etc1_block::unpack_color5(uint& r, uint& g, uint& b, uint16 packed_color5, uint16 packed_delta3, bool scaled, uint alpha) {
  color_quad_u8 result;
  const bool success = unpack_color5(result, packed_color5, packed_delta3, scaled, alpha);
  r = result.r;
  g = result.g;
  b = result.b;
  return success;
}